

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

SimpleBinsSelectExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimpleBinsSelectExprSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::MatchesClauseSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,MatchesClauseSyntax **args_1)

{
  MatchesClauseSyntax *pMVar1;
  SimpleBinsSelectExprSyntax *pSVar2;
  
  pSVar2 = (SimpleBinsSelectExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SimpleBinsSelectExprSyntax *)this->endPtr < pSVar2 + 1) {
    pSVar2 = (SimpleBinsSelectExprSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pSVar2 + 1);
  }
  pMVar1 = *args_1;
  (pSVar2->super_BinsSelectExpressionSyntax).super_SyntaxNode.kind = SimpleBinsSelectExpr;
  (pSVar2->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pSVar2->super_BinsSelectExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pSVar2->expr).ptr = args;
  pSVar2->matchesClause = pMVar1;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pSVar2;
  if (pMVar1 != (MatchesClauseSyntax *)0x0) {
    (pMVar1->super_SyntaxNode).parent = (SyntaxNode *)pSVar2;
  }
  return pSVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }